

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<bool> __thiscall
kj::anon_unknown_35::InMemoryDirectory::tryTransferTo
          (InMemoryDirectory *this,Directory *toDirectory,PathPtr toPath,WriteMode toMode,
          PathPtr fromPath,TransferMode mode)

{
  TransferMode TVar1;
  byte bVar2;
  size_t sVar3;
  String *value;
  Own<const_kj::Directory> *pOVar4;
  RefOrVoid<const_kj::Directory> pDVar5;
  undefined4 in_register_00000084;
  PathPtr PVar6;
  StringPtr name;
  undefined4 in_stack_00000018;
  undefined4 local_98;
  undefined4 uStack_90;
  bool local_75 [13];
  StringPtr local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  OwnOwn<const_kj::Directory> child;
  WriteMode toMode_local;
  Directory *toDirectory_local;
  InMemoryDirectory *this_local;
  PathPtr toPath_local;
  
  child.value.ptr._4_4_ = mode;
  sVar3 = PathPtr::size(&fromPath);
  if (sVar3 < 2) {
    Maybe<bool>::Maybe((Maybe<bool> *)this,(void *)0x0);
  }
  else {
    value = PathPtr::operator[](&fromPath,0);
    StringPtr::StringPtr(&local_68,value);
    name.content.size_ = (size_t)local_68.content.ptr;
    name.content.ptr = (char *)toDirectory;
    tryGetParent((InMemoryDirectory *)local_58,name,(WriteMode)local_68.content.size_);
    kj::_::readMaybe<kj::Directory_const>
              ((_ *)local_48,(Maybe<kj::Own<const_kj::Directory>_> *)local_58);
    Maybe<kj::Own<const_kj::Directory>_>::~Maybe((Maybe<kj::Own<const_kj::Directory>_> *)local_58);
    pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_48);
    TVar1 = child.value.ptr._4_4_;
    if (pOVar4 == (Own<const_kj::Directory> *)0x0) {
      Maybe<bool>::Maybe((Maybe<bool> *)this,(void *)0x0);
    }
    else {
      pOVar4 = kj::_::OwnOwn<const_kj::Directory>::operator*
                         ((OwnOwn<const_kj::Directory> *)local_48);
      pDVar5 = Own<const_kj::Directory>::operator*(pOVar4);
      sVar3 = PathPtr::size(&fromPath);
      PVar6 = PathPtr::slice(&fromPath,1,sVar3);
      local_98 = PVar6.parts.ptr._0_4_;
      uStack_90 = (undefined4)PVar6.parts.size_;
      bVar2 = (**(code **)(((toPath.parts.ptr)->content).ptr + 0xa0))
                        (toPath.parts.ptr,toPath.parts.size_,CONCAT44(in_register_00000084,toMode),
                         TVar1,pDVar5,in_stack_00000018,local_98,uStack_90);
      local_75[0] = (bool)(bVar2 & 1);
      Maybe<bool>::Maybe((Maybe<bool> *)this,local_75);
    }
    kj::_::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_48);
  }
  return (Maybe<bool>)SUB82(this,0);
}

Assistant:

Maybe<bool> tryTransferTo(const Directory& toDirectory, PathPtr toPath, WriteMode toMode,
                            PathPtr fromPath, TransferMode mode) const override {
    if (fromPath.size() <= 1) {
      // If `fromPath` is in this directory (or *is* this directory) then we don't have any
      // optimizations.
      return nullptr;
    }

    // `fromPath` is in a subdirectory. It could turn out that that subdirectory is not an
    // InMemoryDirectory and is instead something `toDirectory` is friendly with. So let's follow
    // the path.

    KJ_IF_MAYBE(child, tryGetParent(fromPath[0], WriteMode::MODIFY)) {
      // OK, switch back to tryTransfer() but use the subdirectory.
      return toDirectory.tryTransfer(toPath, toMode,
          **child, fromPath.slice(1, fromPath.size()), mode);
    } else {
      // Hmm, doesn't exist. Fall back to standard path.
      return nullptr;
    }
  }